

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

string * google::protobuf::strings::Utf8SafeCEscape(string *src)

{
  int iVar1;
  char *src_00;
  unique_ptr<char[],_std::default_delete<char[]>_> *this;
  ulong uVar2;
  string *in_RDI;
  int len;
  unique_ptr<char[],_std::default_delete<char[]>_> dest;
  int dest_length;
  char *in_stack_ffffffffffffff38;
  unique_ptr<char[],_std::default_delete<char[]>_> *in_stack_ffffffffffffff40;
  string *dest_00;
  allocator local_73 [79];
  int local_24;
  undefined1 local_20 [12];
  int local_14;
  
  dest_00 = in_RDI;
  iVar1 = std::__cxx11::string::size();
  local_14 = iVar1 * 4 + 1;
  operator_new__((long)local_14);
  iVar1 = (int)((ulong)local_20 >> 0x20);
  std::unique_ptr<char[],std::default_delete<char[]>>::
  unique_ptr<char*,std::default_delete<char[]>,void,bool>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  src_00 = (char *)std::__cxx11::string::data();
  std::__cxx11::string::size();
  std::unique_ptr<char[],_std::default_delete<char[]>_>::get(in_stack_ffffffffffffff40);
  local_24 = CEscapeInternal(src_00,iVar1,(char *)dest_00,(int)((ulong)in_RDI >> 0x20),
                             SUB81((ulong)in_RDI >> 0x18,0),SUB81((ulong)in_RDI >> 0x10,0));
  this = (unique_ptr<char[],_std::default_delete<char[]>_> *)
         std::unique_ptr<char[],_std::default_delete<char[]>_>::get(in_stack_ffffffffffffff40);
  uVar2 = (ulong)local_24;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,(char *)this,uVar2,local_73);
  std::allocator<char>::~allocator((allocator<char> *)local_73);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(this);
  return dest_00;
}

Assistant:

std::string Utf8SafeCEscape(const std::string &src) {
  const int dest_length = src.size() * 4 + 1; // Maximum possible expansion
  std::unique_ptr<char[]> dest(new char[dest_length]);
  const int len = CEscapeInternal(src.data(), src.size(),
                                  dest.get(), dest_length, false, true);
  GOOGLE_DCHECK_GE(len, 0);
  return std::string(dest.get(), len);
}